

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int readSuperJournal(sqlite3_file *pJrnl,char *zSuper,u32 nSuper)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  i64 szJ;
  u32 local_40;
  uint local_3c;
  uchar aMagic [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *zSuper = '\0';
  iVar2 = (*pJrnl->pMethods->xFileSize)(pJrnl,&szJ);
  if ((0xf < szJ && iVar2 == 0) && (iVar2 = read32bits(pJrnl,szJ + -0x10,&local_3c), iVar2 == 0)) {
    uVar4 = (ulong)local_3c;
    iVar2 = 0;
    if (((local_3c < nSuper) &&
        (((iVar2 = 0, uVar4 != 0 && (long)uVar4 <= szJ + -0x10 &&
          (iVar2 = read32bits(pJrnl,szJ + -0xc,&local_40), iVar2 == 0)) &&
         (iVar2 = (*pJrnl->pMethods->xRead)(pJrnl,aMagic,8,szJ + -8), iVar2 == 0)))) &&
       ((iVar2 = 0, aMagic == (uchar  [8])0xd763a120f905d5d9 &&
        (iVar2 = (*pJrnl->pMethods->xRead)(pJrnl,zSuper,local_3c,(szJ - uVar4) + -0x10), iVar2 == 0)
        ))) {
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        local_40 = local_40 - (int)zSuper[uVar3];
      }
      iVar2 = 0;
      if (local_40 != 0) {
        uVar4 = 0;
      }
      zSuper[uVar4] = '\0';
      zSuper[(int)uVar4 + 1] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int readSuperJournal(sqlite3_file *pJrnl, char *zSuper, u32 nSuper){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of super-journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zSuper[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nSuper
   || len>szJ-16
   || len==0
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zSuper, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the super-journal name */
  for(u=0; u<len; u++){
    cksum -= zSuper[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the super-journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** super-journal filename.
    */
    len = 0;
  }
  zSuper[len] = '\0';
  zSuper[len+1] = '\0';

  return SQLITE_OK;
}